

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void LemonAtExit(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < made_files_count; local_c = local_c + 1) {
    if (successful_exit == 0) {
      remove(made_files[local_c]);
    }
  }
  free(made_files);
  made_files_count = 0;
  made_files = (char **)0x0;
  return;
}

Assistant:

static void LemonAtExit(void)
{
    /* if we failed, delete (most) files we made, to unconfuse build tools. */
    int i;
    for (i = 0; i < made_files_count; i++) {
        if (!successful_exit) {
            remove(made_files[i]);
        }
    }
    free(made_files);
    made_files_count = 0;
    made_files = NULL;
}